

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O1

Qiniu_Error Qiniu_Qetag_DigestBuffer(char *buf,size_t bufSize,char **digest)

{
  _Qiniu_Qetag_Context *ctx_00;
  uint uVar1;
  Qiniu_Error QVar3;
  _Qiniu_Qetag_Context *ctx;
  _Qiniu_Qetag_Context *local_38;
  char *pcVar2;
  
  local_38 = (_Qiniu_Qetag_Context *)0x0;
  QVar3 = Qiniu_Qetag_New(&local_38,(uint)bufSize);
  ctx_00 = local_38;
  pcVar2 = QVar3.message;
  uVar1 = QVar3.code;
  if (uVar1 == 200) {
    QVar3 = Qiniu_Qetag_Update(local_38,buf,bufSize);
    if (QVar3.code == 200) {
      QVar3 = Qiniu_Qetag_Final(ctx_00,digest);
    }
    pcVar2 = QVar3.message;
    uVar1 = QVar3.code;
    if (ctx_00 != (_Qiniu_Qetag_Context *)0x0) {
      free(ctx_00);
    }
  }
  QVar3._4_4_ = 0;
  QVar3.code = uVar1;
  QVar3.message = pcVar2;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_Qetag_DigestBuffer(const char * buf, size_t bufSize, char ** digest)
{
    Qiniu_Error err;
    struct _Qiniu_Qetag_Context * ctx = NULL;

    err = Qiniu_Qetag_New(&ctx, bufSize);
    if (err.code != 200) {
        return err;
    }

    err = Qiniu_Qetag_Update(ctx, buf, bufSize);
    if (err.code != 200) {
        Qiniu_Qetag_Destroy(ctx);
        return err;
    }

    err = Qiniu_Qetag_Final(ctx, digest);
    Qiniu_Qetag_Destroy(ctx);
    return err;
}